

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O2

void UnityPrintFloat(UNITY_DOUBLE input_number)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  char *string;
  long lVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  undefined8 uStack_60;
  char buf [16];
  
  if (input_number < 0.0) {
    uStack_60 = 0x107da6;
    putchar(0x2d);
    input_number = -input_number;
  }
  if ((input_number == 0.0) && (!NAN(input_number))) {
    string = "0";
LAB_00107de5:
    UnityPrint(string);
    return;
  }
  if (NAN(input_number)) {
    string = "nan";
    goto LAB_00107de5;
  }
  if (ABS(input_number) == INFINITY) {
    string = "inf";
    goto LAB_00107de5;
  }
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  fVar11 = 1.0;
  if (1.0 <= input_number) {
    if (input_number <= 1e+07) {
      iVar7 = 0;
      for (iVar2 = (int)input_number; iVar2 < 1000000; iVar2 = iVar2 * 10) {
        fVar11 = fVar11 * 10.0;
        iVar7 = iVar7 + -1;
      }
      fVar11 = (input_number - (float)(int)input_number) * fVar11;
      goto LAB_00107eec;
    }
    iVar7 = 0;
    for (; 1e+16 < input_number; input_number = input_number / 1e+10) {
      iVar7 = iVar7 + 10;
    }
    for (fVar10 = 1.0; fVar11 = input_number / fVar10, 1e+07 < fVar11; fVar10 = fVar10 * 10.0) {
      iVar7 = iVar7 + 1;
    }
  }
  else {
    iVar7 = 0;
    for (; input_number < 0.001; input_number = input_number * 1e+10) {
      iVar7 = iVar7 + -10;
    }
    for (fVar10 = 1.0; fVar11 = input_number * fVar10, fVar11 < 1e+06; fVar10 = fVar10 * 10.0) {
      iVar7 = iVar7 + -1;
    }
  }
  iVar2 = 0;
LAB_00107eec:
  uVar9 = (long)((int)(fVar11 + fVar11) + 1) / 2;
  iVar1 = (int)uVar9;
  if ((((uVar9 & 1) != 0) && ((float)iVar1 - fVar11 == 0.5)) && (!NAN((float)iVar1 - fVar11))) {
    iVar1 = iVar1 + -1;
  }
  iVar1 = iVar1 + iVar2;
  iVar2 = 1000000;
  if (iVar1 < 10000000) {
    iVar2 = iVar1;
  }
  iVar8 = iVar7 + (uint)(9999999 < iVar1);
  uVar4 = 6;
  uVar9 = uVar4;
  if (iVar7 + (uint)(9999999 < iVar1) + 10 < 0xb) {
    uVar4 = (ulong)(uint)-iVar8;
    uVar9 = uVar4;
  }
  while( true ) {
    if (((int)uVar4 < 1) || (iVar2 % 10 != 0)) break;
    uVar4 = uVar4 - 1;
    iVar2 = iVar2 / 10;
  }
  for (uVar6 = 0; (iVar2 != 0 || ((long)uVar6 <= (long)(int)uVar4)); uVar6 = uVar6 + 1) {
    buf[uVar6] = (char)(iVar2 % 10) + '0';
    iVar2 = iVar2 / 10;
  }
  lVar5 = uVar4 - uVar6;
  while (0 < (long)uVar6) {
    if (lVar5 == 0) {
      uStack_60 = 0x107f9c;
      putchar(0x2e);
    }
    uVar6 = uVar6 - 1;
    uStack_60 = 0x107fab;
    putchar((int)buf[uVar6 & 0xffffffff]);
    lVar5 = lVar5 + 1;
  }
  uVar3 = (int)uVar9 + iVar8;
  if (uVar3 != 0) {
    uStack_60 = 0x107fbd;
    putchar(0x65);
    if ((int)uVar3 < 0) {
      uStack_60 = 0x107fd3;
      putchar(0x2d);
      uVar3 = -uVar3;
    }
    else {
      uStack_60 = 0x107fc9;
      putchar(0x2b);
    }
    for (uVar9 = 0; uVar9 < 2 || uVar3 != 0; uVar9 = uVar9 + 1) {
      uVar4 = (ulong)uVar3;
      uVar3 = uVar3 / 10;
      buf[uVar9] = (byte)(uVar4 % 10) | 0x30;
    }
    for (; 0 < (long)uVar9; uVar9 = uVar9 - 1) {
      uStack_60 = 0x10800b;
      putchar((int)buf[uVar9 - 1]);
    }
  }
  return;
}

Assistant:

void UnityPrintFloat(const UNITY_DOUBLE input_number)
{
#ifdef UNITY_INCLUDE_DOUBLE
    static const int sig_digits = 9;
    static const UNITY_INT32 min_scaled = 100000000;
    static const UNITY_INT32 max_scaled = 1000000000;
#else
    static const int sig_digits = 7;
    static const UNITY_INT32 min_scaled = 1000000;
    static const UNITY_INT32 max_scaled = 10000000;
#endif

    UNITY_DOUBLE number = input_number;

    /* print minus sign (does not handle negative zero) */
    if (number < 0.0f)
    {
        UNITY_OUTPUT_CHAR('-');
        number = -number;
    }

    /* handle zero, NaN, and +/- infinity */
    if (number == 0.0f)
    {
        UnityPrint("0");
    }
    else if (isnan(number))
    {
        UnityPrint("nan");
    }
    else if (isinf(number))
    {
        UnityPrint("inf");
    }
    else
    {
        UNITY_INT32 n_int = 0, n;
        int exponent = 0;
        int decimals, digits;
        char buf[16] = {0};

        /*
         * Scale up or down by powers of 10.  To minimize rounding error,
         * start with a factor/divisor of 10^10, which is the largest
         * power of 10 that can be represented exactly.  Finally, compute
         * (exactly) the remaining power of 10 and perform one more
         * multiplication or division.
         */
        if (number < 1.0f)
        {
            UNITY_DOUBLE factor = 1.0f;

            while (number < (UNITY_DOUBLE)max_scaled / 1e10f)  { number *= 1e10f; exponent -= 10; }
            while (number * factor < (UNITY_DOUBLE)min_scaled) { factor *= 10.0f; exponent--; }

            number *= factor;
        }
        else if (number > (UNITY_DOUBLE)max_scaled)
        {
            UNITY_DOUBLE divisor = 1.0f;

            while (number > (UNITY_DOUBLE)min_scaled * 1e10f)   { number  /= 1e10f; exponent += 10; }
            while (number / divisor > (UNITY_DOUBLE)max_scaled) { divisor *= 10.0f; exponent++; }

            number /= divisor;
        }
        else
        {
            /*
             * In this range, we can split off the integer part before
             * doing any multiplications.  This reduces rounding error by
             * freeing up significant bits in the fractional part.
             */
            UNITY_DOUBLE factor = 1.0f;
            n_int = (UNITY_INT32)number;
            number -= (UNITY_DOUBLE)n_int;

            while (n_int < min_scaled) { n_int *= 10; factor *= 10.0f; exponent--; }

            number *= factor;
        }

        /* round to nearest integer */
        n = ((UNITY_INT32)(number + number) + 1) / 2;

#ifndef UNITY_ROUND_TIES_AWAY_FROM_ZERO
        /* round to even if exactly between two integers */
        if ((n & 1) && (((UNITY_DOUBLE)n - number) == 0.5f))
            n--;
#endif

        n += n_int;

        if (n >= max_scaled)
        {
            n = min_scaled;
            exponent++;
        }

        /* determine where to place decimal point */
        decimals = ((exponent <= 0) && (exponent >= -(sig_digits + 3))) ? (-exponent) : (sig_digits - 1);
        exponent += decimals;

        /* truncate trailing zeroes after decimal point */
        while ((decimals > 0) && ((n % 10) == 0))
        {
            n /= 10;
            decimals--;
        }

        /* build up buffer in reverse order */
        digits = 0;
        while ((n != 0) || (digits < (decimals + 1)))
        {
            buf[digits++] = (char)('0' + n % 10);
            n /= 10;
        }
        while (digits > 0)
        {
            if (digits == decimals) { UNITY_OUTPUT_CHAR('.'); }
            UNITY_OUTPUT_CHAR(buf[--digits]);
        }

        /* print exponent if needed */
        if (exponent != 0)
        {
            UNITY_OUTPUT_CHAR('e');

            if (exponent < 0)
            {
                UNITY_OUTPUT_CHAR('-');
                exponent = -exponent;
            }
            else
            {
                UNITY_OUTPUT_CHAR('+');
            }

            digits = 0;
            while ((exponent != 0) || (digits < 2))
            {
                buf[digits++] = (char)('0' + exponent % 10);
                exponent /= 10;
            }
            while (digits > 0)
            {
                UNITY_OUTPUT_CHAR(buf[--digits]);
            }
        }
    }
}